

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O0

CMStateSet * __thiscall xercesc_4_0::CMStateSet::operator=(CMStateSet *this,CMStateSet *srcSet)

{
  RuntimeException *pRVar1;
  ulong local_40;
  XMLSize_t index_1;
  XMLSize_t index;
  CMStateSet *srcSet_local;
  CMStateSet *this_local;
  
  if (this != srcSet) {
    if (this->fBitCount != srcSet->fBitCount) {
      if (this->fDynamicBuffer == (CMDynamicBuffer *)0x0) {
        pRVar1 = (RuntimeException *)__cxa_allocate_exception(0x30);
        RuntimeException::RuntimeException
                  (pRVar1,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/CMStateSet.hpp"
                   ,0x120,Bitset_NotEqualSize,(MemoryManager *)0x0);
        __cxa_throw(pRVar1,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
      }
      pRVar1 = (RuntimeException *)__cxa_allocate_exception(0x30);
      RuntimeException::RuntimeException
                (pRVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/CMStateSet.hpp"
                 ,0x11e,Bitset_NotEqualSize,this->fDynamicBuffer->fMemoryManager);
      __cxa_throw(pRVar1,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
    }
    if (this->fDynamicBuffer == (CMDynamicBuffer *)0x0) {
      for (index_1 = 0; index_1 < 4; index_1 = index_1 + 1) {
        this->fBits[index_1] = srcSet->fBits[index_1];
      }
    }
    else {
      for (local_40 = 0; local_40 < this->fDynamicBuffer->fArraySize; local_40 = local_40 + 1) {
        if (srcSet->fDynamicBuffer->fBitArray[local_40] == (XMLInt32 *)0x0) {
          if (this->fDynamicBuffer->fBitArray[local_40] != (XMLInt32 *)0x0) {
            deallocateChunk(this,local_40);
          }
        }
        else {
          if (this->fDynamicBuffer->fBitArray[local_40] == (XMLInt32 *)0x0) {
            allocateChunk(this,local_40);
          }
          memcpy(this->fDynamicBuffer->fBitArray[local_40],
                 srcSet->fDynamicBuffer->fBitArray[local_40],0x80);
        }
      }
    }
  }
  return this;
}

Assistant:

CMStateSet& operator=(const CMStateSet& srcSet)
    {
        if (this == &srcSet)
            return *this;

        // They have to be the same size
        if (fBitCount != srcSet.fBitCount)
        {
            if(fDynamicBuffer)
                ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Bitset_NotEqualSize, fDynamicBuffer->fMemoryManager);
            else
                ThrowXML(RuntimeException, XMLExcepts::Bitset_NotEqualSize);
        }

        if(fDynamicBuffer==0)
        {
            for (XMLSize_t index = 0; index < CMSTATE_CACHED_INT32_SIZE; index++)
                fBits[index] = srcSet.fBits[index];
        }
        else
        {
            for (XMLSize_t index = 0; index < fDynamicBuffer->fArraySize; index++)
                if(srcSet.fDynamicBuffer->fBitArray[index]==NULL)
                {
                    // delete this subentry
                    if(fDynamicBuffer->fBitArray[index]!=NULL)
                        deallocateChunk(index);
                }
                else
                {
                    // if we haven't allocated the subvector yet, allocate it and copy
                    if(fDynamicBuffer->fBitArray[index]==NULL)
                        allocateChunk(index);
                    memcpy((void *) fDynamicBuffer->fBitArray[index],
                           (const void *) srcSet.fDynamicBuffer->fBitArray[index],
                           CMSTATE_BITFIELD_INT32_SIZE * sizeof(XMLInt32));
                }
        }
        return *this;
    }